

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

upb_DecodeStatus
upb_Decode(char *buf,size_t size,upb_Message *msg,upb_MiniTable *mt,upb_ExtensionRegistry *extreg,
          int options,upb_Arena *arena)

{
  char *__dest;
  upb_DecodeStatus uVar1;
  upb_Decoder decoder;
  
  if (((ulong)msg->field_0 & 1) == 0) {
    if (size < 0x11) {
      __dest = decoder.input.patch;
      decoder.input.patch[0x10] = '\0';
      decoder.input.patch[0x11] = '\0';
      decoder.input.patch[0x12] = '\0';
      decoder.input.patch[0x13] = '\0';
      decoder.input.patch[0x14] = '\0';
      decoder.input.patch[0x15] = '\0';
      decoder.input.patch[0x16] = '\0';
      decoder.input.patch[0x17] = '\0';
      decoder.input.patch[0x18] = '\0';
      decoder.input.patch[0x19] = '\0';
      decoder.input.patch[0x1a] = '\0';
      decoder.input.patch[0x1b] = '\0';
      decoder.input.patch[0x1c] = '\0';
      decoder.input.patch[0x1d] = '\0';
      decoder.input.patch[0x1e] = '\0';
      decoder.input.patch[0x1f] = '\0';
      decoder.input.patch[0] = '\0';
      decoder.input.patch[1] = '\0';
      decoder.input.patch[2] = '\0';
      decoder.input.patch[3] = '\0';
      decoder.input.patch[4] = '\0';
      decoder.input.patch[5] = '\0';
      decoder.input.patch[6] = '\0';
      decoder.input.patch[7] = '\0';
      decoder.input.patch[8] = '\0';
      decoder.input.patch[9] = '\0';
      decoder.input.patch[10] = '\0';
      decoder.input.patch[0xb] = '\0';
      decoder.input.patch[0xc] = '\0';
      decoder.input.patch[0xd] = '\0';
      decoder.input.patch[0xe] = '\0';
      decoder.input.patch[0xf] = '\0';
      if (size != 0) {
        memcpy(__dest,buf,size);
      }
      decoder.input.input_delta = (long)buf - (long)__dest;
      decoder.input.end = __dest + size;
      decoder.input.limit = 0;
      buf = __dest;
    }
    else {
      decoder.input.end = buf + (size - 0x10);
      decoder.input.limit = 0x10;
      decoder.input.input_delta = 0;
    }
    decoder.input.aliasing = (_Bool)((byte)options & 1);
    decoder.input.error = false;
    decoder.depth = 100;
    if (0xffff < (uint)options) {
      decoder.depth = (uint)options >> 0x10;
    }
    decoder.end_group = 0xffffffff;
    decoder.options = (uint16_t)options;
    decoder.missing_required = false;
    decoder.status = kUpb_DecodeStatus_Ok;
    decoder.input.limit_ptr = decoder.input.end;
    decoder.extreg = extreg;
    _upb_Arena_SwapIn_dont_copy_me__upb_internal_use_only(&decoder.field_7.arena,arena);
    uVar1 = upb_Decoder_Decode(&decoder,buf,msg,mt,arena);
    return uVar1;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/decode.c"
                ,0x598,
                "upb_DecodeStatus upb_Decode(const char *, size_t, upb_Message *, const upb_MiniTable *, const upb_ExtensionRegistry *, int, upb_Arena *)"
               );
}

Assistant:

upb_DecodeStatus upb_Decode(const char* buf, size_t size, upb_Message* msg,
                            const upb_MiniTable* mt,
                            const upb_ExtensionRegistry* extreg, int options,
                            upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Decoder decoder;

  upb_EpsCopyInputStream_Init(&decoder.input, &buf, size,
                              options & kUpb_DecodeOption_AliasString);

  decoder.extreg = extreg;
  decoder.depth = upb_DecodeOptions_GetEffectiveMaxDepth(options);
  decoder.end_group = DECODE_NOGROUP;
  decoder.options = (uint16_t)options;
  decoder.missing_required = false;
  decoder.status = kUpb_DecodeStatus_Ok;

  // Violating the encapsulation of the arena for performance reasons.
  // This is a temporary arena that we swap into and swap out of when we are
  // done.  The temporary arena only needs to be able to handle allocation,
  // not fuse or free, so it does not need many of the members to be initialized
  // (particularly parent_or_count).
  UPB_PRIVATE(_upb_Arena_SwapIn)(&decoder.arena, arena);

  return upb_Decoder_Decode(&decoder, buf, msg, mt, arena);
}